

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeData.cpp
# Opt level: O0

void __thiscall TPZShapeData::Print(TPZShapeData *this,ostream *out)

{
  ostream *poVar1;
  int64_t iVar2;
  pair<int,_long> *ppVar3;
  ostream *in_RSI;
  long in_RDI;
  int64_t i;
  MatrixOutputFormat in_stack_000002fc;
  ostream *in_stack_00000300;
  char *in_stack_00000308;
  TPZMatrix<double> *in_stack_00000310;
  TPZMatrix<double> *in_stack_ffffffffffffff78;
  ostream *in_stack_ffffffffffffff80;
  long local_48;
  TPZShapeData *in_stack_ffffffffffffffc8;
  string local_30 [32];
  ostream *local_10;
  
  local_10 = in_RSI;
  poVar1 = std::operator<<(in_RSI,"Shape function type ");
  ShapeFunctionType_abi_cxx11_(in_stack_ffffffffffffffc8);
  poVar1 = std::operator<<(poVar1,local_30);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_30);
  TPZMatrix<double>::Print(in_stack_00000310,in_stack_00000308,in_stack_00000300,in_stack_000002fc);
  TPZMatrix<double>::Print(in_stack_00000310,in_stack_00000308,in_stack_00000300,in_stack_000002fc);
  std::operator<<(local_10,"fMasterDirections");
  poVar1 = ::operator<<(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  iVar2 = TPZVec<std::pair<int,_long>_>::size((TPZVec<std::pair<int,_long>_> *)(in_RDI + 0x3510));
  if (iVar2 != 0) {
    std::operator<<(local_10,"VecShapeIndex: ");
    local_48 = 0;
    while( true ) {
      iVar2 = TPZVec<std::pair<int,_long>_>::size
                        ((TPZVec<std::pair<int,_long>_> *)(in_RDI + 0x3510));
      if (iVar2 <= local_48) break;
      poVar1 = local_10;
      ppVar3 = TPZVec<std::pair<int,_long>_>::operator[]
                         ((TPZVec<std::pair<int,_long>_> *)(in_RDI + 0x3510),local_48);
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,ppVar3->first);
      poVar1 = std::operator<<(poVar1,'/');
      ppVar3 = TPZVec<std::pair<int,_long>_>::operator[]
                         ((TPZVec<std::pair<int,_long>_> *)(in_RDI + 0x3510),local_48);
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,ppVar3->second);
      std::operator<<(poVar1,' ');
      local_48 = local_48 + 1;
    }
    std::operator<<(local_10,'\n');
  }
  return;
}

Assistant:

void TPZShapeData::Print(std::ostream &out) const
{
    out << "Shape function type " << ShapeFunctionType() << std::endl;
    fPhi.Print("phi",out);
    fDPhi.Print("dphi",out);
    out << "fMasterDirections" << fMasterDirections << std::endl;
    if (fSDVecShapeIndex.size()) {
        out << "VecShapeIndex: ";
        for (int64_t i = 0; i < fSDVecShapeIndex.size(); i++) {
            out << fSDVecShapeIndex[i].first << '/' << fSDVecShapeIndex[i].second << ' ';
        }
        out << '\n';
    }
}